

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stepper.cpp
# Opt level: O2

void __thiscall QtMWidgets::Stepper::setValue(Stepper *this,int val)

{
  int iVar1;
  StepperPrivate *this_00;
  int iVar2;
  
  this_00 = (this->d).d;
  iVar1 = this_00->value;
  iVar2 = StepperPrivate::bound(this_00,val);
  this_00->value = iVar2;
  StepperPrivate::enableButtons(this_00);
  iVar2 = ((this->d).d)->value;
  if (iVar1 == iVar2) {
    return;
  }
  valueChanged(this,iVar2);
  return;
}

Assistant:

void
Stepper::setValue( int val )
{
	const int old = d->value;

	d->value = d->bound( val );

	d->enableButtons();

	if( old != d->value )
		emit valueChanged( d->value );
}